

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O2

void __thiscall
OpenMesh::PolyConnectivity::adjust_outgoing_halfedge(PolyConnectivity *this,VertexHandle _vh)

{
  bool bVar1;
  value_type vVar2;
  Vertex *pVVar3;
  undefined1 local_38 [8];
  ConstVertexOHalfedgeIter vh_it;
  
  cvoh_iter((ConstVertexOHalfedgeIter *)local_38,this,_vh);
  while( true ) {
    if (vh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ == -1) {
      return;
    }
    if (((int)vh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ ==
         vh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_) &&
       (vh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.idx_
        != 0)) break;
    vVar2 = Iterators::
            GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
            ::operator*((ConstVertexOHalfedgeIter *)local_38);
    bVar1 = ArrayKernel::is_boundary
                      (&this->super_ArrayKernel,(HalfedgeHandle)vVar2.super_BaseHandle.idx_);
    if (bVar1) {
      vVar2 = Iterators::
              GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
              ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                           *)local_38);
      pVVar3 = ArrayKernel::vertex(&this->super_ArrayKernel,_vh);
      (pVVar3->halfedge_handle_).super_BaseHandle.idx_ = (int)vVar2.super_BaseHandle.idx_;
      return;
    }
    Iterators::
    GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
    ::operator++((ConstVertexOHalfedgeIter *)local_38);
  }
  return;
}

Assistant:

void PolyConnectivity::adjust_outgoing_halfedge(VertexHandle _vh)
{
  for (ConstVertexOHalfedgeIter vh_it=cvoh_iter(_vh); vh_it.is_valid(); ++vh_it)
  {
    if (is_boundary(*vh_it))
    {
      set_halfedge_handle(_vh, *vh_it);
      break;
    }
  }
}